

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2TextureSharingTest::renderResource
          (GLES2TextureSharingTest *this,Surface *screen,Surface *reference)

{
  glUseProgramFunc p_Var1;
  glGetAttribLocationFunc p_Var2;
  glGetUniformLocationFunc p_Var3;
  glReadPixelsFunc p_Var4;
  deUint64 __s;
  bool bVar5;
  GLenum GVar6;
  deBool dVar7;
  deUint32 dVar8;
  int iVar9;
  int iVar10;
  TestError *pTVar11;
  void *pvVar12;
  float *pfVar13;
  float fVar14;
  RGBA local_2ec;
  int local_2e8;
  int local_2e4;
  int a;
  int b;
  int g;
  int r;
  Sampler local_2c8;
  undefined1 local_28c [8];
  Vec4 color;
  float lod;
  float s;
  float t;
  int y;
  int x;
  GLint local_240;
  GLuint local_23c;
  GLuint samplerLocation;
  GLuint texCoordLocation;
  GLuint coordLocation;
  int height;
  int width;
  allocator<char> local_1f1;
  string local_1f0;
  ProgramSources local_1d0;
  undefined1 local_100 [8];
  ShaderProgram program;
  char *fragmentShader;
  char *vertexShader;
  Surface *reference_local;
  Surface *screen_local;
  GLES2TextureSharingTest *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)anon_var_dwarf_a4de04;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,
             "attribute mediump vec2 a_pos;\nattribute mediump vec2 a_texCorod;\nvarying mediump vec2 v_texCoord;\nvoid main(void)\n{\n\tv_texCoord = a_texCorod;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
             ,&local_1f1);
  __s = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&width,(char *)__s,(allocator<char> *)((long)&height + 3));
  glu::makeVtxFragSources(&local_1d0,&local_1f0,(string *)&width);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_100,&(this->super_GLES2SharingTest).m_gl,&local_1d0);
  glu::ProgramSources::~ProgramSources(&local_1d0);
  std::__cxx11::string::~string((string *)&width);
  std::allocator<char>::~allocator((allocator<char> *)((long)&height + 3));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_100);
  if (!bVar5) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x219);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  coordLocation = 0xf0;
  texCoordLocation = 0xf0;
  if (screen != (Surface *)0x0) {
    coordLocation = tcu::Surface::getWidth(screen);
    texCoordLocation = tcu::Surface::getHeight(screen);
  }
  do {
    (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,coordLocation,texCoordLocation);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"viewport(0, 0, width, height)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x237);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x239);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x23a);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  do {
    p_Var1 = (this->super_GLES2SharingTest).m_gl.useProgram;
    dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
    (*p_Var1)(dVar8);
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar6,"useProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x23c);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  p_Var2 = (this->super_GLES2SharingTest).m_gl.getAttribLocation;
  dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
  samplerLocation = (*p_Var2)(dVar8,"a_pos");
  GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar6,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23f);
  while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (samplerLocation != 0xffffffff))) {
    dVar7 = ::deGetFalse();
    if (dVar7 == 0) {
      p_Var2 = (this->super_GLES2SharingTest).m_gl.getAttribLocation;
      dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      local_23c = (*p_Var2)(dVar8,"a_texCorod");
      GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar6,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x243);
      while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (local_23c != 0xffffffff))) {
        dVar7 = ::deGetFalse();
        if (dVar7 == 0) {
          p_Var3 = (this->super_GLES2SharingTest).m_gl.getUniformLocation;
          dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
          local_240 = (*p_Var3)(dVar8,"u_sampler");
          GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar6,"glGetUniformLocation()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x248);
          while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (local_240 != -1))) {
            dVar7 = ::deGetFalse();
            if (dVar7 == 0) {
              do {
                (*(this->super_GLES2SharingTest).m_gl.activeTexture)(0x84c0);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"activeTexture(GL_TEXTURE0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x24b);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,this->m_glTexture);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"bindTexture(GL_TEXTURE_2D, m_glTexture)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x24c);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.uniform1i)(local_240,0);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"uniform1i(samplerLocation, 0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x24e);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(local_23c);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"enableVertexAttribArray(texCoordLocation)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x250);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(samplerLocation);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"enableVertexAttribArray(coordLocation)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x251);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                          (local_23c,2,0x1406,'\0',0,renderResource::texCoords);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,
                                "vertexAttribPointer(texCoordLocation, 2, GL_FLOAT, GL_FALSE, 0, texCoords)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x253);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                          (samplerLocation,2,0x1406,'\0',0,renderResource::coords);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,
                                "vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x254);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.drawElements)
                          (4,6,0x1403,renderResource::indices);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x256);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(samplerLocation);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"disableVertexAttribArray(coordLocation)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,599);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(local_23c);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"disableVertexAttribArray(texCoordLocation)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,600);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,0);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"bindTexture(GL_TEXTURE_2D, 0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x25a);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              do {
                (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
                GVar6 = (*(this->super_GLES2SharingTest).m_gl.getError)();
                glu::checkError(GVar6,"useProgram(0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                                ,0x25b);
                dVar7 = ::deGetFalse();
              } while (dVar7 != 0);
              if (screen != (Surface *)0x0) {
                p_Var4 = (this->super_GLES2SharingTest).m_gl.readPixels;
                iVar9 = tcu::Surface::getWidth(screen);
                iVar10 = tcu::Surface::getHeight(screen);
                tcu::Surface::getAccess((PixelBufferAccess *)&y,screen);
                pvVar12 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&y);
                (*p_Var4)(0,0,iVar9,iVar10,0x1908,0x1401,pvVar12);
                for (t = 0.0; (int)t < (int)coordLocation; t = (float)((int)t + 1)) {
                  for (s = 0.0; (int)s < (int)texCoordLocation; s = (float)((int)s + 1)) {
                    fVar14 = (float)(int)coordLocation;
                    color.m_data[3] = (float)(int)s / ((float)(int)texCoordLocation - 1.0);
                    color.m_data[2] = 0.0;
                    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&g,0.0,0.0,0.0,0.0);
                    tcu::Sampler::Sampler
                              (&local_2c8,REPEAT_GL,REPEAT_GL,REPEAT_GL,LINEAR,LINEAR,0.0,true,
                               COMPAREMODE_NONE,0,(Vec4 *)&g,false,MODE_DEPTH);
                    tcu::Texture2D::sample
                              ((Texture2D *)local_28c,(Sampler *)&this->m_texture,
                               (float)(int)t / (fVar14 - 1.0),color.m_data[3],color.m_data[2]);
                    pfVar13 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_28c);
                    b = ::deClamp32((int)(*pfVar13 * 255.0),0,0xff);
                    pfVar13 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_28c);
                    a = ::deClamp32((int)(*pfVar13 * 255.0),0,0xff);
                    pfVar13 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_28c);
                    local_2e4 = ::deClamp32((int)(*pfVar13 * 255.0),0,0xff);
                    pfVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_28c);
                    local_2e8 = ::deClamp32((int)(*pfVar13 * 255.0),0,0xff);
                    tcu::RGBA::RGBA(&local_2ec,b,a,local_2e4,local_2e8);
                    tcu::Surface::setPixel(reference,(int)t,(int)s,local_2ec);
                  }
                }
              }
              glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
              return;
            }
          }
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,(char *)0x0,"samplerLocation != (GLuint)-1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                     ,0x249);
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,(char *)0x0,"texCoordLocation != (GLuint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                 ,0x244);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,(char *)0x0,"coordLocation != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x240);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GLES2TextureSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec2 a_texCorod;\n"
	"varying mediump vec2 v_texCoord;\n"
	"void main(void)\n"
	"{\n"
	"\tv_texCoord = a_texCorod;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec2 v_texCoord;\n"
	"uniform sampler2D u_sampler;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = texture2D(u_sampler, v_texCoord);\n"
	"}\n";

	glu::ShaderProgram program(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-1.0f, -1.0f,
		 1.0f, -1.0f,
		 1.0f,  1.0f,
		-1.0f,  1.0f
	};

	static const GLfloat texCoords[] = {
		0.0f, 0.0f,
		1.0f, 0.0f,
		1.0f, 1.0f,
		0.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	GLuint coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint texCoordLocation = m_gl.getAttribLocation(program.getProgram(), "a_texCorod");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(texCoordLocation != (GLuint)-1);


	GLuint samplerLocation = m_gl.getUniformLocation(program.getProgram(), "u_sampler");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(samplerLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, activeTexture(GL_TEXTURE0));
	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, m_glTexture));

	GLU_CHECK_GLW_CALL(m_gl, uniform1i(samplerLocation, 0));

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(texCoordLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(texCoordLocation, 2, GL_FLOAT, GL_FALSE, 0, texCoords));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(texCoordLocation));

	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, 0));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		for (int x = 0; x < width; x++)
		{
			for (int y = 0; y < height; y++)
			{
				float t = ((float)x / ((float)width - 1.0f));
				float s = ((float)y / ((float)height - 1.0f));
				float lod = 0.0f;

				tcu::Vec4 color = m_texture.sample(tcu::Sampler(tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR), t, s, lod);

				int r = deClamp32((int)(255.0f * color.x()), 0, 255);
				int g = deClamp32((int)(255.0f * color.y()), 0, 255);
				int b = deClamp32((int)(255.0f * color.z()), 0, 255);
				int a = deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(r, g, b, a));
			}
		}
	}
}